

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::tri_edge_inter_tail
          (tetgenmesh *this,double *A,double *B,double *C,double *P,double *Q,double s_p,double s_q)

{
  int iVar1;
  int local_68;
  int ni;
  int pos [4];
  int types [2];
  double s_q_local;
  double s_p_local;
  double *Q_local;
  double *P_local;
  double *C_local;
  double *B_local;
  double *A_local;
  tetgenmesh *this_local;
  
  iVar1 = tri_edge_tail(this,A,B,C,P,Q,(point)0x0,s_p,s_q,1,pos + 2,&local_68);
  if (0 < iVar1) {
    if (iVar1 == 2) {
      if (pos[2] == 2) {
        return 2;
      }
      return 1;
    }
    if (iVar1 == 4) {
      if (pos[2] != 2) {
        if (pos[2] == 3) {
          return 3;
        }
        return 1;
      }
      if (pos[3] == 0) {
        return 2;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::tri_edge_inter_tail(REAL* A, REAL* B, REAL* C,  REAL* P, 
                                    REAL* Q, REAL s_p, REAL s_q)
{
  int types[2], pos[4];
  int ni;  // =0, 2, 4

  ni = tri_edge_tail(A, B, C, P, Q, NULL, s_p, s_q, 1, types, pos);

  if (ni > 0) {
    if (ni == 2) {
      // Get the intersection type.
      if (types[0] == (int) SHAREVERT) {
        return (int) SHAREVERT;
      } else {
        return (int) INTERSECT;
      }
    } else if (ni == 4) { 
      // There may be two intersections.
      if (types[0] == (int) SHAREVERT) {
        if (types[1] == (int) DISJOINT) {
          return (int) SHAREVERT;
        } else {
          return (int) INTERSECT;
        }
      } else {
        if (types[0] == (int) SHAREEDGE) {
          return (int) SHAREEDGE;
        } else {
          return (int) INTERSECT;
        }
      }
    }
  }

  return (int) DISJOINT;
}